

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void AddSpecialSearchParams(Args *args,SearchParams<DNA> *sp)

{
  Strand SVar1;
  bool bVar2;
  mapped_type *this;
  string *psVar3;
  key_type local_68;
  undefined1 local_48 [8];
  string str;
  
  std::__cxx11::string::string
            ((string *)&local_68,"--strand",(allocator *)(str.field_2._M_local_buf + 0xf));
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_docopt::value>_>_>
         ::at(args,&local_68);
  psVar3 = docopt::value::asString_abi_cxx11_(this);
  std::__cxx11::string::string((string *)local_48,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_68);
  sp->strand = Plus;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"minus");
  if (bVar2) {
    SVar1 = Minus;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"both");
    if (!bVar2) goto LAB_00162e06;
    SVar1 = Both;
  }
  sp->strand = SVar1;
LAB_00162e06:
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void AddSpecialSearchParams( const Args& args, SearchParams< DNA >* sp ) {
  auto str = args.at( "--strand" ).asString();
  sp->strand = DNA::Strand::Plus;
  if( str == "minus" ) {
    sp->strand = DNA::Strand::Minus;
  } else if( str == "both" ) {
    sp->strand = DNA::Strand::Both;
  }
}